

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::SyncToSetAndBackupInst<false>::Exec
          (SyncToSetAndBackupInst<false> *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint64 *puVar1;
  Char CVar2;
  CharCount CVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  
  uVar4 = (this->super_BackupMixin).backup.lower;
  CVar3 = *matchStart;
  if (inputLength - CVar3 < uVar4) {
LAB_00f02d39:
    *matchStart = inputLength;
    bVar6 = true;
  }
  else {
    if (*inputOffset < *nextSyncInputOffset) {
      *instPointer = *instPointer + 0x31;
    }
    else {
      if (*inputOffset - CVar3 < uVar4) {
        *inputOffset = CVar3 + uVar4;
      }
      uVar4 = *inputOffset;
      if (uVar4 < inputLength) {
        do {
          CVar2 = input[uVar4];
          if ((ushort)CVar2 < 0x100) {
            bVar6 = ((this->super_SetMixin<false>).set.direct.vec[(ushort)CVar2 >> 5] >>
                     ((ushort)CVar2 & 0x1f) & 1) != 0;
LAB_00f02db8:
            if (bVar6 != false) break;
          }
          else if ((this->super_SetMixin<false>).set.root != (CharSetNode *)0x0) {
            bVar6 = RuntimeCharSet<char16_t>::Get_helper
                              (&(this->super_SetMixin<false>).set,(uint)(ushort)CVar2);
            goto LAB_00f02db8;
          }
          if (matcher->stats != (Type)0x0) {
            puVar1 = &matcher->stats->numCompares;
            *puVar1 = *puVar1 + 1;
          }
          uVar4 = *inputOffset + 1;
          *inputOffset = uVar4;
        } while (uVar4 < inputLength);
      }
      if (inputLength <= *inputOffset) goto LAB_00f02d39;
      *nextSyncInputOffset = *inputOffset + 1;
      uVar4 = (this->super_BackupMixin).backup.upper;
      if (uVar4 != 0xffffffff) {
        uVar5 = *inputOffset - *matchStart;
        if (uVar4 <= uVar5) {
          uVar5 = uVar4;
        }
        *matchStart = *inputOffset - uVar5;
      }
      *inputOffset = *matchStart;
      *instPointer = *instPointer + 0x31;
    }
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

inline bool SyncToSetAndBackupInst<IsNegation>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        if (backup.lower > inputLength - matchStart)
        {
            // Even match at very end doesn't allow for minimum backup
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        if (inputOffset < nextSyncInputOffset)
        {
            // We have not yet reached the offset in the input we last synced to before backing up, so it's unnecessary to sync
            // again since we'll sync to the same point in the input and back up to the same place we are at now
            instPointer += sizeof(*this);
            return false;
        }

        if (backup.lower > inputOffset - matchStart)
        {
            // No use looking for match until minimum backup is possible
            inputOffset = matchStart + backup.lower;
        }

        const RuntimeCharSet<Char>& matchSet = this->set;
        while (inputOffset < inputLength && matchSet.Get(input[inputOffset]) == IsNegation)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.CompStats();
#endif
            inputOffset++;
        }

        if (inputOffset >= inputLength)
        {
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        nextSyncInputOffset = inputOffset + 1;

        if (backup.upper != CharCountFlag)
        {
            // Backup at most by backup.upper for new start
            CharCount maxBackup = inputOffset - matchStart;
            matchStart = inputOffset - min(maxBackup, (CharCount)backup.upper);
        }
        // else: leave start where it is

        // Move input to new match start
        inputOffset = matchStart;
        instPointer += sizeof(*this);
        return false;
    }